

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_random_dist.h
# Opt level: O0

void __thiscall PlayerRandomDist::PlayerRandomDist(PlayerRandomDist *this,string *name)

{
  time_t tVar1;
  Player *in_RSI;
  string *in_RDI;
  
  Player::Player(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__PlayerRandomDist_0011ba80;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  return;
}

Assistant:

PlayerRandomDist(const std::string& name) :
		Player(name)
	{
		srand(time(0));
	}